

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::ImageTests::addCreateTextureCubemapActions
          (ImageTests *this,string *suffix,GLenum internalFormat,GLenum format,GLenum type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"cubemap_positive_x",suffix);
  addCreateTexture(this,&local_50,0x30b3,internalFormat,format,type);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,"cubemap_positive_y",suffix);
  addCreateTexture(this,&local_50,0x30b5,internalFormat,format,type);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,"cubemap_positive_z",suffix);
  addCreateTexture(this,&local_50,0x30b7,internalFormat,format,type);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,"cubemap_negative_x",suffix);
  addCreateTexture(this,&local_50,0x30b4,internalFormat,format,type);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,"cubemap_negative_y",suffix);
  addCreateTexture(this,&local_50,0x30b6,internalFormat,format,type);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,"cubemap_negative_z",suffix);
  addCreateTexture(this,&local_50,0x30b8,internalFormat,format,type);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void ImageTests::addCreateTextureCubemapActions (const string& suffix, GLenum internalFormat, GLenum format, GLenum type)
{
	addCreateTexture("cubemap_positive_x" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_positive_y" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_positive_z" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_negative_x" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_negative_y" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR, internalFormat,	format,	type);
	addCreateTexture("cubemap_negative_z" + suffix,	EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR, internalFormat,	format,	type);
}